

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t BIT_initCStream(BIT_CStream_t *bitC,void *startPtr,size_t dstCapacity)

{
  size_t dstCapacity_local;
  void *startPtr_local;
  BIT_CStream_t *bitC_local;
  
  bitC->bitContainer = 0;
  bitC->bitPos = 0;
  bitC->startPtr = (char *)startPtr;
  bitC->ptr = bitC->startPtr;
  bitC->endPtr = bitC->startPtr + (dstCapacity - 8);
  if (dstCapacity < 9) {
    bitC_local = (BIT_CStream_t *)0xffffffffffffffba;
  }
  else {
    bitC_local = (BIT_CStream_t *)0x0;
  }
  return (size_t)bitC_local;
}

Assistant:

MEM_STATIC size_t BIT_initCStream(BIT_CStream_t* bitC,
                                  void* startPtr, size_t dstCapacity)
{
    bitC->bitContainer = 0;
    bitC->bitPos = 0;
    bitC->startPtr = (char*)startPtr;
    bitC->ptr = bitC->startPtr;
    bitC->endPtr = bitC->startPtr + dstCapacity - sizeof(bitC->bitContainer);
    if (dstCapacity <= sizeof(bitC->bitContainer)) return ERROR(dstSize_tooSmall);
    return 0;
}